

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

uint32 gflags::ParseCommandLineFlagsInternal
                 (int *argc,char ***argv,bool remove_flags,bool do_report)

{
  char **__dest;
  size_type sVar1;
  uint32 *puVar2;
  char cVar3;
  bool bVar4;
  CommandLineFlag *pCVar5;
  char *pcVar6;
  char *pcVar7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  _Rb_tree_node_base *p_Var10;
  mapped_type *pmVar11;
  uint32 uVar12;
  Mutex *pMVar13;
  uint uVar14;
  uint uVar15;
  char *pcVar16;
  allocator local_211;
  uint32 *local_210;
  string key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string error_message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  char *local_180;
  CommandLineFlagParser parser;
  key_type local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_210 = (uint32 *)argc;
  SetArgv(*argc,*argv);
  parser.registry_ = anon_unknown_2::FlagRegistry::GlobalRegistry();
  parser.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &parser.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header;
  parser.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  parser.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  parser.error_flags_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header;
  parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pMVar13 = &(parser.registry_)->lock_;
  parser.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       parser.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  gflags_mutex_namespace::Mutex::Lock(pMVar13);
  anon_unknown_2::CommandLineFlagParser::ProcessFlagfileLocked
            (&local_70,&parser,fLS::FLAGS_flagfile_abi_cxx11_,SET_FLAGS_VALUE);
  std::__cxx11::string::~string((string *)&local_70);
  uVar14 = 1;
  anon_unknown_2::CommandLineFlagParser::ProcessFromenvLocked
            (&local_90,&parser,fLS::FLAGS_fromenv_abi_cxx11_,SET_FLAGS_VALUE,true);
  std::__cxx11::string::~string((string *)&local_90);
  anon_unknown_2::CommandLineFlagParser::ProcessFromenvLocked
            (&local_b0,&parser,fLS::FLAGS_tryfromenv_abi_cxx11_,SET_FLAGS_VALUE,false);
  std::__cxx11::string::~string((string *)&local_b0);
  gflags_mutex_namespace::Mutex::Unlock(pMVar13);
  uVar12 = *local_210;
  gflags_mutex_namespace::Mutex::Lock(&(parser.registry_)->lock_);
  while( true ) {
    while( true ) {
      puVar2 = local_210;
      if ((int)uVar12 <= (int)uVar14) goto LAB_0013d1f8;
      pcVar16 = (*argv)[(int)uVar14];
      if ((*pcVar16 == '-') && (cVar3 = pcVar16[1], cVar3 != '\0')) break;
      __dest = *argv + (int)uVar14;
      memmove(__dest,__dest + 1,(long)(int)(*local_210 + ~uVar14) << 3);
      (*argv)[(long)(int)*puVar2 + -1] = pcVar16;
      uVar12 = uVar12 - 1;
    }
    if (cVar3 == '-') {
      cVar3 = pcVar16[2];
      pcVar16 = pcVar16 + 2;
    }
    else {
      pcVar16 = pcVar16 + 1;
    }
    if (cVar3 == '\0') break;
    key._M_dataplus._M_p = (pointer)&key.field_2;
    key._M_string_length = 0;
    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
    error_message._M_string_length = 0;
    key.field_2._M_local_buf[0] = '\0';
    error_message.field_2._M_local_buf[0] = '\0';
    pCVar5 = anon_unknown_2::FlagRegistry::SplitArgumentLocked
                       (parser.registry_,pcVar16,&key,&local_180,&error_message);
    if (pCVar5 == (CommandLineFlag *)0x0) {
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&parser.undefined_names_,&key);
      std::__cxx11::string::assign((char *)pmVar11);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&parser.error_flags_,&key);
      std::__cxx11::string::_M_assign((string *)pmVar11);
    }
    else {
      pcVar16 = local_180;
      if (local_180 == (char *)0x0) {
        cVar3 = pCVar5->defvalue_->type_;
        if (cVar3 == '\0') {
          __assert_fail("flag->Type() != FlagValue::FV_BOOL",
                        "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/gflags.cc"
                        ,0x42d,
                        "uint32 gflags::(anonymous namespace)::CommandLineFlagParser::ParseNewCommandLineFlags(int *, char ***, bool)"
                       );
        }
        uVar15 = uVar14 + 1;
        if ((int)uVar12 <= (int)uVar15) {
          std::__cxx11::string::string((string *)&local_f0,"ERROR: ",&local_211);
          std::operator+(&local_d0,&local_f0,"flag \'");
          std::operator+(&local_110,&local_d0,(*argv)[(int)uVar14]);
          std::operator+(&local_1e0,&local_110,"\'");
          std::operator+(&local_1a0,&local_1e0," is missing its argument");
          pmVar11 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&parser.error_flags_,&key);
          std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_1e0);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_f0);
          if ((pCVar5->help_ != (char *)0x0) && ('\x01' < *pCVar5->help_)) {
            std::__cxx11::string::string
                      ((string *)&local_1e0,"; flag description: ",(allocator *)&local_110);
            std::operator+(&local_1a0,&local_1e0,pCVar5->help_);
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&parser.error_flags_,&key);
            std::__cxx11::string::append((string *)pmVar11);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::~string((string *)&local_1e0);
          }
          pmVar11 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&parser.error_flags_,&key);
          std::__cxx11::string::append((char *)pmVar11);
          std::__cxx11::string::~string((string *)&error_message);
          std::__cxx11::string::~string((string *)&key);
LAB_0013d1f8:
          gflags_mutex_namespace::Mutex::Unlock(&(parser.registry_)->lock_);
          if (remove_flags) {
            (*argv)[(long)(int)uVar12 + -1] = **argv;
            *argv = *argv + (long)(int)uVar12 + -1;
            *local_210 = (*local_210 - uVar12) + 1;
            uVar12 = 1;
          }
          if (do_report) {
            HandleCommandLineHelpFlags();
          }
          pMVar13 = &(parser.registry_)->lock_;
          gflags_mutex_namespace::Mutex::Lock(pMVar13);
          for (p_Var10 = ((parser.registry_)->flags_)._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_left;
              (_Rb_tree_header *)p_Var10 !=
              &((parser.registry_)->flags_)._M_t._M_impl.super__Rb_tree_header;
              p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
            pCVar5 = (CommandLineFlag *)p_Var10[1]._M_parent;
            if ((pCVar5->modified_ == false) &&
               (bVar4 = anon_unknown_2::CommandLineFlag::Validate(pCVar5,pCVar5->current_), !bVar4))
            {
              std::__cxx11::string::string
                        ((string *)&key,*(char **)p_Var10[1]._M_parent,(allocator *)&error_message);
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&parser.error_flags_,&key);
              sVar1 = pmVar11->_M_string_length;
              std::__cxx11::string::~string((string *)&key);
              if (sVar1 == 0) {
                std::__cxx11::string::string((string *)&local_1e0,"ERROR: ",(allocator *)&local_d0);
                std::operator+(&local_1a0,&local_1e0,"--");
                std::operator+(&error_message,&local_1a0,*(char **)p_Var10[1]._M_parent);
                std::operator+(&key,&error_message," must be set on the commandline");
                std::__cxx11::string::string
                          ((string *)&local_110,*(char **)p_Var10[1]._M_parent,
                           (allocator *)&local_f0);
                pmVar11 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&parser.error_flags_,&local_110);
                std::__cxx11::string::operator=((string *)pmVar11,(string *)&key);
                std::__cxx11::string::~string((string *)&local_110);
                std::__cxx11::string::~string((string *)&key);
                std::__cxx11::string::~string((string *)&error_message);
                std::__cxx11::string::~string((string *)&local_1a0);
                std::__cxx11::string::~string((string *)&local_1e0);
                p_Var9 = p_Var10[1]._M_parent;
                if (*(char *)&p_Var9->_M_right == '\0') {
                  std::__cxx11::string::string
                            ((string *)&key,*(char **)p_Var9,(allocator *)&error_message);
                  pmVar11 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](&parser.error_flags_,&key);
                  std::__cxx11::string::append((char *)pmVar11);
                  std::__cxx11::string::~string((string *)&key);
                  p_Var9 = p_Var10[1]._M_parent;
                }
                std::__cxx11::string::string
                          ((string *)&key,*(char **)p_Var9,(allocator *)&error_message);
                pmVar11 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&parser.error_flags_,&key);
                std::__cxx11::string::append((char *)pmVar11);
                std::__cxx11::string::~string((string *)&key);
              }
            }
          }
          gflags_mutex_namespace::Mutex::Unlock(pMVar13);
          bVar4 = anon_unknown_2::CommandLineFlagParser::ReportErrors(&parser);
          if (!bVar4) {
            anon_unknown_2::CommandLineFlagParser::~CommandLineFlagParser(&parser);
            return uVar12;
          }
          uVar12 = (*(code *)gflags_exitfunc)(1);
          return uVar12;
        }
        pcVar16 = (*argv)[(int)uVar15];
        uVar14 = uVar15;
        if ((cVar3 == '\x06') && (*pcVar16 == '-')) {
          pcVar7 = pCVar5->help_;
          pcVar6 = strstr(pcVar7,"true");
          if ((pcVar6 != (char *)0x0) || (pcVar7 = strstr(pcVar7,"false"), pcVar7 != (char *)0x0)) {
            poVar8 = std::operator<<((ostream *)&std::cerr,"Did you really mean to set flag \'");
            poVar8 = std::operator<<(poVar8,pCVar5->name_);
            poVar8 = std::operator<<(poVar8,"\' to the value \'");
            poVar8 = std::operator<<(poVar8,pcVar16);
            std::operator<<(poVar8,"\'?");
          }
        }
      }
      (anonymous_namespace)::CommandLineFlagParser::ProcessSingleOptionLocked_abi_cxx11_
                (&local_50,&parser,pCVar5,pcVar16,SET_FLAGS_VALUE);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::~string((string *)&error_message);
    std::__cxx11::string::~string((string *)&key);
    uVar14 = uVar14 + 1;
  }
  uVar12 = uVar14 + 1;
  goto LAB_0013d1f8;
}

Assistant:

static uint32 ParseCommandLineFlagsInternal(int* argc, char*** argv,
                                            bool remove_flags, bool do_report) {
  SetArgv(*argc, const_cast<const char**>(*argv));    // save it for later

  FlagRegistry* const registry = FlagRegistry::GlobalRegistry();
  CommandLineFlagParser parser(registry);

  // When we parse the commandline flags, we'll handle --flagfile,
  // --tryfromenv, etc. as we see them (since flag-evaluation order
  // may be important).  But sometimes apps set FLAGS_tryfromenv/etc.
  // manually before calling ParseCommandLineFlags.  We want to evaluate
  // those too, as if they were the first flags on the commandline.
  registry->Lock();
  parser.ProcessFlagfileLocked(FLAGS_flagfile, SET_FLAGS_VALUE);
  // Last arg here indicates whether flag-not-found is a fatal error or not
  parser.ProcessFromenvLocked(FLAGS_fromenv, SET_FLAGS_VALUE, true);
  parser.ProcessFromenvLocked(FLAGS_tryfromenv, SET_FLAGS_VALUE, false);
  registry->Unlock();

  // Now get the flags specified on the commandline
  const int r = parser.ParseNewCommandLineFlags(argc, argv, remove_flags);

  if (do_report)
    HandleCommandLineHelpFlags();   // may cause us to exit on --help, etc.

  // See if any of the unset flags fail their validation checks
  parser.ValidateUnmodifiedFlags();

  if (parser.ReportErrors())        // may cause us to exit on illegal flags
    gflags_exitfunc(1);
  return r;
}